

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O2

void __thiscall
ncnn::Yolov3DetectionOutput::nms_sorted_bboxes
          (Yolov3DetectionOutput *this,
          vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
          *bboxes,vector<unsigned_long,_std::allocator<unsigned_long>_> *picked,float nms_threshold)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  pointer puVar5;
  pointer pBVar6;
  pointer pBVar7;
  pointer pBVar8;
  unsigned_long uVar9;
  ulong uVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  ulong local_30;
  
  puVar5 = (picked->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((picked->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar5) {
    (picked->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar5;
  }
  pBVar6 = (bboxes->
           super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pBVar7 = (bboxes->
           super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_30 = 0;
  do {
    if ((ulong)(((long)pBVar6 - (long)pBVar7) / 0x1c) <= local_30) {
      return;
    }
    pBVar8 = (bboxes->
             super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
             )._M_impl.super__Vector_impl_data._M_start;
    puVar5 = (picked->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = (ulong)((long)(picked->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)puVar5) >> 3;
    uVar11 = uVar10 & 0xffffffff;
    if ((int)uVar10 < 1) {
      uVar11 = 0;
    }
    uVar10 = 0;
    do {
      if (uVar11 == uVar10) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(picked,&local_30);
        break;
      }
      uVar9 = puVar5[uVar10];
      fVar1 = pBVar8[local_30].xmin;
      fVar12 = pBVar8[uVar9].xmax;
      fVar16 = 0.0;
      if (fVar1 <= fVar12) {
        fVar2 = pBVar8[local_30].xmax;
        fVar14 = pBVar8[uVar9].xmin;
        if (fVar14 <= fVar2) {
          fVar3 = pBVar8[local_30].ymin;
          fVar13 = pBVar8[uVar9].ymax;
          if (fVar3 <= fVar13) {
            fVar4 = pBVar8[local_30].ymax;
            fVar15 = pBVar8[uVar9].ymin;
            if (fVar15 <= fVar4) {
              if (fVar2 <= fVar12) {
                fVar12 = fVar2;
              }
              if (fVar14 <= fVar1) {
                fVar14 = fVar1;
              }
              if (fVar4 <= fVar13) {
                fVar13 = fVar4;
              }
              if (fVar15 <= fVar3) {
                fVar15 = fVar3;
              }
              fVar16 = (fVar13 - fVar15) * (fVar12 - fVar14);
            }
          }
        }
      }
      uVar10 = uVar10 + 1;
    } while (fVar16 <= ((pBVar8[local_30].area - fVar16) + pBVar8[uVar9].area) * nms_threshold);
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

void Yolov3DetectionOutput::nms_sorted_bboxes(std::vector<BBoxRect>& bboxes, std::vector<size_t>& picked, float nms_threshold) const
{
    picked.clear();

    const size_t n = bboxes.size();

    for (size_t i = 0; i < n; i++)
    {
        const BBoxRect& a = bboxes[i];

        int keep = 1;
        for (int j = 0; j < (int)picked.size(); j++)
        {
            const BBoxRect& b = bboxes[picked[j]];

            // intersection over union
            float inter_area = intersection_area(a, b);
            float union_area = a.area + b.area - inter_area;
            // float IoU = inter_area / union_area
            if (inter_area > nms_threshold * union_area)
            {
                keep = 0;
                break;
            }
        }

        if (keep)
            picked.push_back(i);
    }
}